

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::full_box::print(full_box *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *this_00;
  full_box *this_local;
  
  box::print(&this->super_box);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2,"version: ");
  poVar2 = std::operator<<(poVar2,(this->super_box).field_0x62);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2,"flags: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,*(uint *)&(this->super_box).field_0x64);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void full_box::print() const
	{
		box::print();
		std::cout << std::setw(33) << std::left << "version: " << this->version_ << std::endl;
		std::cout << std::setw(33) << std::left << "flags: " << flags_ << std::endl;
	}